

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.hpp
# Opt level: O2

ssize_t __thiscall inja::Environment::write(Environment *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  undefined4 in_register_00000034;
  path local_278;
  path local_250;
  ofstream file;
  
  ::std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_250,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__n,
             auto_format);
  std::filesystem::__cxx11::operator/(&local_278,&this->output_path,&local_250);
  ::std::ofstream::ofstream(&file,local_278._M_pathname._M_dataplus._M_p,_S_out);
  std::filesystem::__cxx11::path::~path(&local_278);
  std::filesystem::__cxx11::path::~path(&local_250);
  render_file(&local_278._M_pathname,this,(path *)CONCAT44(in_register_00000034,__fd),(json *)__buf)
  ;
  ::std::operator<<((ostream *)&file,(string *)&local_278);
  ::std::__cxx11::string::~string((string *)&local_278);
  ::std::ofstream::close();
  sVar1 = ::std::ofstream::~ofstream(&file);
  return sVar1;
}

Assistant:

void write(const std::filesystem::path& filename, const json& data, const std::string& filename_out) {
    std::ofstream file(output_path / filename_out);
    file << render_file(filename, data);
    file.close();
  }